

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall Poisson::setParameter(Poisson *this,string *name,string *value)

{
  bool bVar1;
  stringstream local_1a8 [8];
  stringstream parameter;
  ostream local_198;
  string *local_20;
  string *value_local;
  string *name_local;
  Poisson *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,(string *)local_20);
  bVar1 = std::operator==(value_local,"rate");
  if (bVar1) {
    std::istream::operator>>((istream *)local_1a8,&this->poissonRate);
    this->poissonRate =
         ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
          super_TimeDependent.xTime)->dt * this->poissonRate;
  }
  else {
    Parametric::setParameter((Parametric *)this,value_local,local_20);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void Poisson::setParameter(const string& name, const string& value)
{
	stringstream parameter;
	parameter << value;
	if (name=="rate") {
		parameter >> poissonRate;
		poissonRate *= xTime->dt;
	}
	else
		StochasticEventGenerator::setParameter( name, value );
}